

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderRectFilledWithHole
               (ImDrawList *draw_list,ImRect outer,ImRect inner,ImU32 col,float rounding)

{
  undefined8 uVar1;
  ImDrawList *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  bool fill_D;
  bool fill_U;
  bool fill_R;
  bool fill_L;
  undefined8 in_stack_ffffffffffffff10;
  ImDrawFlags flags;
  ImDrawList *in_stack_ffffffffffffff18;
  ImDrawList *in_stack_ffffffffffffff20;
  ImDrawList *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  flags = (ImDrawFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  local_10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_8 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_20._0_4_ = (float)in_XMM2_Qa;
  local_31 = in_XMM0_Da < (float)local_20;
  local_18._0_4_ = (float)in_XMM3_Qa;
  local_32 = (float)local_18 < in_XMM1_Da;
  local_20._4_4_ = (float)((ulong)in_XMM2_Qa >> 0x20);
  local_33 = in_XMM0_Db < local_20._4_4_;
  local_18._4_4_ = (float)((ulong)in_XMM3_Qa >> 0x20);
  local_34 = local_18._4_4_ < in_XMM1_Db;
  local_28 = in_RDI;
  uVar1 = in_XMM2_Qa;
  local_18 = in_XMM3_Qa;
  if (in_XMM0_Da < (float)local_20) {
    uVar1 = in_XMM2_Qa;
    ImVec2::ImVec2(&local_3c,in_XMM0_Da,local_20._4_4_);
    local_20 = uVar1;
    ImVec2::ImVec2(&local_44,(float)local_20,local_18._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
    uVar1 = local_20;
  }
  local_20 = uVar1;
  if ((local_32 & 1) != 0) {
    ImVec2::ImVec2(&local_4c,(float)local_18,local_20._4_4_);
    ImVec2::ImVec2(&local_54,(float)local_8,local_18._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
  }
  if ((local_33 & 1) != 0) {
    in_stack_ffffffffffffff30 = local_28;
    ImVec2::ImVec2(&local_5c,(float)local_20,local_10._4_4_);
    ImVec2::ImVec2(&local_64,(float)local_18,local_20._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
  }
  if ((local_34 & 1) != 0) {
    in_stack_ffffffffffffff28 = local_28;
    ImVec2::ImVec2(&local_6c,(float)local_20,local_18._4_4_);
    ImVec2::ImVec2(&local_74,(float)local_18,local_8._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
  }
  if (((local_31 & 1) != 0) && ((local_33 & 1) != 0)) {
    in_stack_ffffffffffffff20 = local_28;
    ImVec2::ImVec2(&local_7c,(float)local_10,local_10._4_4_);
    ImVec2::ImVec2(&local_84,(float)local_20,local_20._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
  }
  if (((local_32 & 1) != 0) && ((local_33 & 1) != 0)) {
    in_stack_ffffffffffffff18 = local_28;
    ImVec2::ImVec2(&local_8c,(float)local_18,local_10._4_4_);
    ImVec2::ImVec2(&local_94,(float)local_8,local_20._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
  }
  if (((local_31 & 1) != 0) && ((local_34 & 1) != 0)) {
    ImVec2::ImVec2(&local_9c,(float)local_10,local_18._4_4_);
    ImVec2::ImVec2(&local_a4,(float)local_20,local_8._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),local_28._4_4_);
    flags = local_28._4_4_;
  }
  if (((local_32 & 1) != 0) && ((local_34 & 1) != 0)) {
    ImVec2::ImVec2(&local_ac,(float)local_18,local_18._4_4_);
    ImVec2::ImVec2(&local_b4,(float)local_8,local_8._4_4_);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,(ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20)
               ,SUB84(in_stack_ffffffffffffff18,0),flags);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledWithHole(ImDrawList* draw_list, ImRect outer, ImRect inner, ImU32 col, float rounding)
{
    const bool fill_L = (inner.Min.x > outer.Min.x);
    const bool fill_R = (inner.Max.x < outer.Max.x);
    const bool fill_U = (inner.Min.y > outer.Min.y);
    const bool fill_D = (inner.Max.y < outer.Max.y);
    if (fill_L) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Min.y), ImVec2(inner.Min.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomLeft));
    if (fill_R) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Min.y), ImVec2(outer.Max.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopRight)   | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_U) draw_list->AddRectFilled(ImVec2(inner.Min.x, outer.Min.y), ImVec2(inner.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_R ? 0 : ImDrawFlags_RoundCornersTopRight));
    if (fill_D) draw_list->AddRectFilled(ImVec2(inner.Min.x, inner.Max.y), ImVec2(inner.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersBottomLeft) | (fill_R ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_L && fill_U) draw_list->AddRectFilled(ImVec2(outer.Min.x, outer.Min.y), ImVec2(inner.Min.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopLeft);
    if (fill_R && fill_U) draw_list->AddRectFilled(ImVec2(inner.Max.x, outer.Min.y), ImVec2(outer.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopRight);
    if (fill_L && fill_D) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Max.y), ImVec2(inner.Min.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomLeft);
    if (fill_R && fill_D) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Max.y), ImVec2(outer.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomRight);
}